

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::emit_mesh_tasks(CompilerGLSL *this,SPIRBlock *block)

{
  string local_70;
  string local_50;
  string local_30;
  
  to_unpacked_expression_abi_cxx11_(&local_50,this,(block->mesh).groups[0].id,true);
  to_unpacked_expression_abi_cxx11_(&local_70,this,(block->mesh).groups[1].id,true);
  to_unpacked_expression_abi_cxx11_(&local_30,this,(block->mesh).groups[2].id,true);
  statement<char_const(&)[18],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
            (this,(char (*) [18])"EmitMeshTasksEXT(",&local_50,(char (*) [3])0x376a17,&local_70,
             (char (*) [3])0x376a17,&local_30,(char (*) [3])0x361553);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_mesh_tasks(SPIRBlock &block)
{
	statement("EmitMeshTasksEXT(",
	          to_unpacked_expression(block.mesh.groups[0]), ", ",
	          to_unpacked_expression(block.mesh.groups[1]), ", ",
	          to_unpacked_expression(block.mesh.groups[2]), ");");
}